

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

int GPU_GetNumActiveRenderers(void)

{
  int iVar1;
  long lVar2;
  
  gpu_init_renderer_register();
  iVar1 = 0;
  for (lVar2 = 0; lVar2 != 0xa0; lVar2 = lVar2 + 8) {
    iVar1 = (iVar1 + 1) - (uint)(*(long *)((long)_gpu_renderer_map + lVar2) == 0);
  }
  return iVar1;
}

Assistant:

int GPU_GetNumActiveRenderers(void)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] != NULL)
			count++;
	}
	return count;
}